

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationRootElements::getSecondaryBefore(CollationRootElements *this,uint32_t p,uint32_t s)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t uVar3;
  uint *puVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t *puVar7;
  
  if (p == 0) {
    puVar7 = this->elements;
    uVar3 = puVar7[1];
    uVar6 = puVar7[(int)uVar3];
    uVar5 = 0;
  }
  else {
    iVar2 = findP(this,p);
    puVar7 = this->elements;
    uVar3 = iVar2 + 1;
    uVar1 = puVar7[(long)iVar2 + 1];
    uVar6 = uVar1;
    if (0x50004ff < uVar1) {
      uVar6 = 0x5000500;
    }
    if (-1 < (char)uVar1) {
      uVar6 = 0x5000500;
    }
    uVar5 = 0x100;
  }
  if (uVar6 >> 0x10 < s) {
    puVar4 = puVar7 + (int)uVar3;
    uVar6 = uVar6 >> 0x10;
    do {
      uVar5 = uVar6;
      uVar1 = *puVar4;
      puVar4 = puVar4 + 1;
      uVar6 = uVar1 >> 0x10;
    } while (uVar1 >> 0x10 < s);
  }
  return uVar5;
}

Assistant:

uint32_t
CollationRootElements::getSecondaryBefore(uint32_t p, uint32_t s) const {
    int32_t index;
    uint32_t previousSec, sec;
    if(p == 0) {
        index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
        // Gap at the beginning of the secondary CE range.
        previousSec = 0;
        sec = elements[index] >> 16;
    } else {
        index = findPrimary(p) + 1;
        previousSec = Collation::BEFORE_WEIGHT16;
        sec = getFirstSecTerForPrimary(index) >> 16;
    }
    U_ASSERT(s >= sec);
    while(s > sec) {
        previousSec = sec;
        U_ASSERT((elements[index] & SEC_TER_DELTA_FLAG) != 0);
        sec = elements[index++] >> 16;
    }
    U_ASSERT(sec == s);
    return previousSec;
}